

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O1

double __thiscall Imath_2_5::Vec4<double>::lengthTiny(Vec4<double> *this)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar8 = this->x;
  dVar3 = this->y;
  uVar1 = -(ulong)(dVar8 < -dVar8);
  uVar2 = -(ulong)(dVar3 < -dVar3);
  dVar5 = (double)(~uVar1 & (ulong)dVar8 | (ulong)-dVar8 & uVar1);
  dVar6 = (double)(~uVar2 & (ulong)dVar3 | (ulong)-dVar3 & uVar2);
  dVar8 = this->z;
  uVar1 = -(ulong)(dVar8 < -dVar8);
  dVar7 = (double)(~uVar1 & (ulong)dVar8 | (ulong)-dVar8 & uVar1);
  dVar8 = this->w;
  uVar1 = -(ulong)(dVar8 < -dVar8);
  dVar3 = (double)(~uVar1 & (ulong)dVar8 | (ulong)-dVar8 & uVar1);
  dVar8 = dVar6;
  if (dVar6 <= dVar5) {
    dVar8 = dVar5;
  }
  dVar4 = dVar7;
  if (dVar7 <= dVar8) {
    dVar4 = dVar8;
  }
  dVar8 = dVar3;
  if (dVar3 <= dVar4) {
    dVar8 = dVar4;
  }
  dVar4 = 0.0;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    dVar4 = (dVar3 / dVar8) * (dVar3 / dVar8) +
            (dVar7 / dVar8) * (dVar7 / dVar8) +
            (dVar5 / dVar8) * (dVar5 / dVar8) + (dVar6 / dVar8) * (dVar6 / dVar8);
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar4 = dVar8 * dVar4;
  }
  return dVar4;
}

Assistant:

T
Vec4<T>::lengthTiny () const
{
    T absX = (x >= T (0))? x: -x;
    T absY = (y >= T (0))? y: -y;
    T absZ = (z >= T (0))? z: -z;
    T absW = (w >= T (0))? w: -w;
    
    T max = absX;

    if (max < absY)
        max = absY;

    if (max < absZ)
        max = absZ;

    if (max < absW)
        max = absW;

    if (max == T (0))
        return T (0);

    //
    // Do not replace the divisions by max with multiplications by 1/max.
    // Computing 1/max can overflow but the divisions below will always
    // produce results less than or equal to 1.
    //

    absX /= max;
    absY /= max;
    absZ /= max;
    absW /= max;

    return max *
        Math<T>::sqrt (absX * absX + absY * absY + absZ * absZ + absW * absW);
}